

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestCase::AddTestInfo(TestCase *this,TestInfo *test_info)

{
  size_type sVar1;
  long in_FS_OFFSET;
  TestCase *this_local;
  TestInfo *local_18;
  TestInfo *test_info_local;
  
  test_info_local = *(TestInfo **)(in_FS_OFFSET + 0x28);
  local_18 = test_info;
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::push_back
            (&this->test_info_list_,&local_18);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->test_indices_);
  this_local._4_4_ = (undefined4)sVar1;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->test_indices_,(value_type_conflict1 *)((long)&this_local + 4));
  if (*(TestInfo **)(in_FS_OFFSET + 0x28) == test_info_local) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestCase::AddTestInfo(TestInfo * test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}